

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O0

stack * stack_create(void)

{
  stack *stack;
  
  stack = (stack *)malloc(0x10);
  if (stack == (stack *)0x0) {
    stack = (stack *)0x0;
  }
  else {
    stack->length = 0;
    stack->head = (stack_item *)0x0;
  }
  return stack;
}

Assistant:

struct stack *stack_create(void)
{
        struct stack *stack = malloc(sizeof(struct stack));

        if (stack == NULL) {
                return NULL;
        }

        stack->length = 0;
        stack->head = NULL;

        return stack;
}